

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O3

int mraa_set_priority(int priority)

{
  int iVar1;
  sched_param local_c;
  
  iVar1 = sched_get_priority_max(2);
  if (iVar1 < priority) {
    priority = sched_get_priority_max(2);
  }
  local_c.__sched_priority = priority;
  iVar1 = sched_setscheduler(0,2,&local_c);
  return iVar1;
}

Assistant:

int
mraa_set_priority(const int priority)
{
    struct sched_param sched_s;

    memset(&sched_s, 0, sizeof(struct sched_param));
    if (priority > sched_get_priority_max(SCHED_RR)) {
        sched_s.sched_priority = sched_get_priority_max(SCHED_RR);
    } else {
        sched_s.sched_priority = priority;
    }

    return sched_setscheduler(0, SCHED_RR, &sched_s);
}